

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementHandle.cpp
# Opt level: O0

void __thiscall Rml::HandleEdgeMarginParser::HandleEdgeMarginParser(HandleEdgeMarginParser *this)

{
  PropertyId PVar1;
  ShorthandId SVar2;
  PropertyDefinition *pPVar3;
  allocator<char> local_2f1;
  String local_2f0;
  allocator<char> local_2c9;
  String local_2c8;
  allocator<char> local_2a1;
  String local_2a0;
  allocator<char> local_279;
  String local_278;
  allocator<char> local_251;
  String local_250;
  allocator<char> local_229;
  String local_228;
  allocator<char> local_201;
  String local_200;
  allocator<char> local_1d9;
  String local_1d8;
  allocator<char> local_1b1;
  String local_1b0;
  allocator<char> local_189;
  String local_188;
  allocator<char> local_161;
  String local_160;
  allocator<char> local_139;
  String local_138;
  allocator<char> local_111;
  String local_110;
  allocator<char> local_e9;
  String local_e8;
  allocator<char> local_c1;
  String local_c0;
  allocator<char> local_99;
  String local_98;
  allocator<char> local_71;
  String local_70;
  allocator<char> local_39;
  String local_38;
  undefined4 local_14;
  HandleEdgeMarginParser *local_10;
  HandleEdgeMarginParser *this_local;
  
  local_10 = this;
  PropertySpecification::PropertySpecification(&this->specification,4,1);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"edge-t",&local_39);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"",&local_71);
  pPVar3 = PropertySpecification::RegisterProperty
                     (&this->specification,&local_38,&local_70,false,false,Invalid);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"length_percent",&local_99);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"",&local_c1);
  pPVar3 = PropertyDefinition::AddParser(pPVar3,&local_98,&local_c0);
  PVar1 = PropertyDefinition::GetId(pPVar3);
  local_14._0_1_ = PVar1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,"edge-r",&local_e9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"",&local_111);
  pPVar3 = PropertySpecification::RegisterProperty
                     (&this->specification,&local_e8,&local_110,false,false,Invalid);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_138,"length_percent",&local_139);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"",&local_161);
  pPVar3 = PropertyDefinition::AddParser(pPVar3,&local_138,&local_160);
  PVar1 = PropertyDefinition::GetId(pPVar3);
  local_14._1_1_ = PVar1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_188,"edge-b",&local_189);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"",&local_1b1);
  pPVar3 = PropertySpecification::RegisterProperty
                     (&this->specification,&local_188,&local_1b0,false,false,Invalid);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1d8,"length_percent",&local_1d9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_200,"",&local_201);
  pPVar3 = PropertyDefinition::AddParser(pPVar3,&local_1d8,&local_200);
  PVar1 = PropertyDefinition::GetId(pPVar3);
  local_14._2_1_ = PVar1;
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"edge-l",&local_229);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"",&local_251);
  pPVar3 = PropertySpecification::RegisterProperty
                     (&this->specification,&local_228,&local_250,false,false,Invalid);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_278,"length_percent",&local_279);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"",&local_2a1);
  pPVar3 = PropertyDefinition::AddParser(pPVar3,&local_278,&local_2a0);
  PVar1 = PropertyDefinition::GetId(pPVar3);
  local_14._3_1_ = PVar1;
  *(undefined4 *)(this->ids)._M_elems = local_14;
  ::std::__cxx11::string::~string((string *)&local_2a0);
  ::std::allocator<char>::~allocator(&local_2a1);
  ::std::__cxx11::string::~string((string *)&local_278);
  ::std::allocator<char>::~allocator(&local_279);
  ::std::__cxx11::string::~string((string *)&local_250);
  ::std::allocator<char>::~allocator(&local_251);
  ::std::__cxx11::string::~string((string *)&local_228);
  ::std::allocator<char>::~allocator(&local_229);
  ::std::__cxx11::string::~string((string *)&local_200);
  ::std::allocator<char>::~allocator(&local_201);
  ::std::__cxx11::string::~string((string *)&local_1d8);
  ::std::allocator<char>::~allocator(&local_1d9);
  ::std::__cxx11::string::~string((string *)&local_1b0);
  ::std::allocator<char>::~allocator(&local_1b1);
  ::std::__cxx11::string::~string((string *)&local_188);
  ::std::allocator<char>::~allocator(&local_189);
  ::std::__cxx11::string::~string((string *)&local_160);
  ::std::allocator<char>::~allocator(&local_161);
  ::std::__cxx11::string::~string((string *)&local_138);
  ::std::allocator<char>::~allocator(&local_139);
  ::std::__cxx11::string::~string((string *)&local_110);
  ::std::allocator<char>::~allocator(&local_111);
  ::std::__cxx11::string::~string((string *)&local_e8);
  ::std::allocator<char>::~allocator(&local_e9);
  ::std::__cxx11::string::~string((string *)&local_c0);
  ::std::allocator<char>::~allocator(&local_c1);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::allocator<char>::~allocator(&local_99);
  ::std::__cxx11::string::~string((string *)&local_70);
  ::std::allocator<char>::~allocator(&local_71);
  ::std::__cxx11::string::~string((string *)&local_38);
  ::std::allocator<char>::~allocator(&local_39);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2c8,"edge-margin",&local_2c9);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f0,"edge-t, edge-r, edge-b, edge-l",&local_2f1);
  SVar2 = PropertySpecification::RegisterShorthand
                    (&this->specification,&local_2c8,&local_2f0,Box,Invalid);
  this->id_constraint = SVar2;
  ::std::__cxx11::string::~string((string *)&local_2f0);
  ::std::allocator<char>::~allocator(&local_2f1);
  ::std::__cxx11::string::~string((string *)&local_2c8);
  ::std::allocator<char>::~allocator(&local_2c9);
  return;
}

Assistant:

HandleEdgeMarginParser() : specification(4, 1)
	{
		ids = {
			specification.RegisterProperty("edge-t", "", false, false).AddParser("length_percent").GetId(),
			specification.RegisterProperty("edge-r", "", false, false).AddParser("length_percent").GetId(),
			specification.RegisterProperty("edge-b", "", false, false).AddParser("length_percent").GetId(),
			specification.RegisterProperty("edge-l", "", false, false).AddParser("length_percent").GetId(),
		};
		id_constraint = specification.RegisterShorthand("edge-margin", "edge-t, edge-r, edge-b, edge-l", ShorthandType::Box);
	}